

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O1

void __thiscall
absl::lts_20250127::Cord::CharIterator::CharIterator(CharIterator *this,Nonnull<const_Cord_*> cord)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dd;
  
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  (this->chunk_iterator_).current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  (this->chunk_iterator_).bytes_remaining_ = 0;
  (this->chunk_iterator_).current_chunk_._M_len = 0;
  (this->chunk_iterator_).current_chunk_._M_str = (char *)0x0;
  (this->chunk_iterator_).btree_reader_.remaining_ = 0;
  (this->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) == 0) {
      uVar3 = (ulong)(long)(char)bVar1 >> 1;
      (this->chunk_iterator_).bytes_remaining_ = uVar3;
      pcVar4 = (char *)0x0;
      if (((cord->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        pcVar4 = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
      }
      (this->chunk_iterator_).current_chunk_._M_len = uVar3;
      (this->chunk_iterator_).current_chunk_._M_str = pcVar4;
      return;
    }
    Cord::CharIterator();
    uVar5 = extraout_XMM0_Da;
    uVar6 = extraout_XMM0_Db;
    uVar7 = extraout_XMM0_Dc;
    uVar8 = extraout_XMM0_Dd;
  }
  else {
    sVar2 = tree->length;
    (this->chunk_iterator_).bytes_remaining_ = sVar2;
    if (sVar2 != 0) {
      ChunkIterator::InitTree(&this->chunk_iterator_,tree);
      return;
    }
  }
  *(undefined4 *)&(this->chunk_iterator_).current_chunk_._M_len = uVar5;
  *(undefined4 *)((long)&(this->chunk_iterator_).current_chunk_._M_len + 4) = uVar6;
  *(undefined4 *)&(this->chunk_iterator_).current_chunk_._M_str = uVar7;
  *(undefined4 *)((long)&(this->chunk_iterator_).current_chunk_._M_str + 4) = uVar8;
  return;
}

Assistant:

inline Cord::ChunkIterator::ChunkIterator(absl::Nonnull<const Cord*> cord) {
  if (CordRep* tree = cord->contents_.tree()) {
    bytes_remaining_ = tree->length;
    if (ABSL_PREDICT_TRUE(bytes_remaining_ != 0)) {
      InitTree(tree);
    } else {
      current_chunk_ = {};
    }
  } else {
    bytes_remaining_ = cord->contents_.inline_size();
    current_chunk_ = {cord->contents_.data(), bytes_remaining_};
  }
}